

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O2

void __thiscall vera::Vbo::addIndices(Vbo *this,GLuint *_indices,int _nIndices)

{
  ostream *poVar1;
  
  if (this->m_isUploaded == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Vbo cannot add indices after upload!");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_indices,
             (const_iterator)
             (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish,_indices,_indices + _nIndices);
  this->m_nIndices = this->m_nIndices + _nIndices;
  return;
}

Assistant:

void Vbo::addIndices(INDEX_TYPE_GL* _indices, int _nIndices) {
    if (m_isUploaded) {
        std::cout << "Vbo cannot add indices after upload!" << std::endl;
        return;
    }

    // if (m_nVertices >= MAX_INDEX_VALUE) {
    //     std::cout << "WARNING: Vertex buffer full, not adding indices" << std::endl;
    //     return;
    // }

    m_indices.insert(m_indices.end(), _indices, _indices + _nIndices);
    m_nIndices += _nIndices;
}